

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  ImDrawList *pIVar1;
  float *pfVar2;
  ImGuiNavMoveResult *pIVar3;
  int *piVar4;
  ImVec2 *pIVar5;
  ImVec2 *pIVar6;
  ImVec2 IVar7;
  ImFontAtlas *pIVar8;
  ImGuiWindow **ppIVar9;
  ImGuiPopupData *pIVar10;
  ImVec2 IVar11;
  ImVec2 IVar12;
  byte bVar13;
  ImGuiContext *pIVar14;
  ImGuiContext *pIVar15;
  ImGuiContext *pIVar16;
  ImGuiContext *pIVar17;
  ImGuiID IVar18;
  bool bVar19;
  bool bVar20;
  int i;
  ImGuiID IVar21;
  ImGuiInputSource IVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  ImGuiWindow *pIVar26;
  ImGuiWindow **__dest;
  ImGuiPopupData *__dest_00;
  int i_1;
  ImGuiID IVar27;
  ImGuiWindow *window;
  char *pcVar28;
  ImGuiWindow *parent_window;
  ImGuiWindow *pIVar29;
  ulong uVar30;
  int i_2;
  ImGuiDir IVar31;
  ImGuiNavMoveResult *pIVar32;
  ImGuiID IVar33;
  float *pfVar34;
  ulong uVar35;
  ImGuiNavLayer IVar36;
  ImGuiID IVar37;
  ImFont *font;
  float *pfVar38;
  ImGuiContext *g_3;
  ImGuiContext *g_1;
  ImGuiWindow *old_nav_window;
  bool *pbVar39;
  ImGuiContext *g;
  bool bVar40;
  byte bVar41;
  uint uVar42;
  uint uVar43;
  float fVar44;
  ImVec2 IVar45;
  ImVec2 IVar46;
  ImVec2 IVar47;
  ImVec2 IVar48;
  ImVec2 IVar49;
  ImVec2 IVar51;
  double dVar50;
  undefined1 auVar52 [16];
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  ImRect rect_abs;
  ImRect local_68;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImRect local_40;
  
  pIVar14 = GImGui;
  bVar41 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd61,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6a,"void ImGui::NewFrame()");
  }
  fVar60 = (GImGui->IO).DeltaTime;
  iVar24 = GImGui->FrameCount;
  if (fVar60 <= 0.0) {
    if (iVar24 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0xd6b,"void ImGui::NewFrame()");
    }
  }
  else if ((iVar24 != 0) && (GImGui->FrameCountEnded != iVar24)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6c,"void ImGui::NewFrame()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6d,"void ImGui::NewFrame()");
  }
  pIVar8 = (GImGui->IO).Fonts;
  if ((pIVar8->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6e,"void ImGui::NewFrame()");
  }
  if ((*(pIVar8->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6f,"void ImGui::NewFrame()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd70,"void ImGui::NewFrame()");
  }
  fVar53 = (GImGui->Style).Alpha;
  if ((fVar53 < 0.0) || (1.0 < fVar53)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd71,"void ImGui::NewFrame()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd72,"void ImGui::NewFrame()");
  }
  lVar25 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar25] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown)/sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0xd74,"void ImGui::NewFrame()");
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x15);
  if ((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd78,"void ImGui::NewFrame()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar14->SettingsLoaded == false) {
    if ((pIVar14->SettingsWindows).Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0xd81,"void ImGui::NewFrame()");
    }
    pcVar28 = (pIVar14->IO).IniFilename;
    if (pcVar28 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar28);
      fVar60 = (pIVar14->IO).DeltaTime;
    }
    pIVar14->SettingsLoaded = true;
  }
  if ((0.0 < pIVar14->SettingsDirtyTimer) &&
     (fVar53 = pIVar14->SettingsDirtyTimer - fVar60, pIVar14->SettingsDirtyTimer = fVar53,
     fVar53 <= 0.0)) {
    pcVar28 = (pIVar14->IO).IniFilename;
    if (pcVar28 == (char *)0x0) {
      (pIVar14->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar28);
      fVar60 = (pIVar14->IO).DeltaTime;
    }
    pIVar14->SettingsDirtyTimer = 0.0;
  }
  pIVar14->Time = (double)fVar60 + pIVar14->Time;
  pIVar14->FrameScopeActive = true;
  pIVar14->FrameCount = pIVar14->FrameCount + 1;
  pIVar14->TooltipOverrideCount = 0;
  pIVar14->WindowsActiveCount = 0;
  ((pIVar14->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar8 = (GImGui->IO).Fonts;
    if ((pIVar8->Fonts).Size < 1) {
      pcVar28 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_001219f3:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.h"
                    ,0x4d7,pcVar28);
    }
    font = *(pIVar8->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar14->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd9e,"void ImGui::NewFrame()");
  }
  fVar60 = (pIVar14->IO).DisplaySize.x;
  fVar53 = (pIVar14->IO).DisplaySize.y;
  (pIVar14->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar14->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar14->DrawListSharedData).ClipRectFullscreen.z = fVar60;
  (pIVar14->DrawListSharedData).ClipRectFullscreen.w = fVar53;
  (pIVar14->DrawListSharedData).CurveTessellationTol = (pIVar14->Style).CurveTessellationTol;
  pIVar1 = &pIVar14->BackgroundDrawList;
  ImDrawList::Clear(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar14->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  (pIVar14->BackgroundDrawList).Flags =
       (uint)(pIVar14->Style).AntiAliasedLines + (uint)(pIVar14->Style).AntiAliasedFill * 2;
  pIVar1 = &pIVar14->ForegroundDrawList;
  ImDrawList::Clear(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar14->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  (pIVar14->ForegroundDrawList).Flags =
       (uint)(pIVar14->Style).AntiAliasedLines + (uint)(pIVar14->Style).AntiAliasedFill * 2;
  (pIVar14->DrawData).Valid = false;
  (pIVar14->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar14->DrawData).CmdListsCount = 0;
  (pIVar14->DrawData).TotalIdxCount = 0;
  (pIVar14->DrawData).TotalVtxCount = 0;
  (pIVar14->DrawData).DisplayPos.x = 0.0;
  *(undefined8 *)&(pIVar14->DrawData).DisplayPos.y = 0;
  (pIVar14->DrawData).DisplaySize.x = 0.0;
  (pIVar14->DrawData).DisplaySize.y = 0.0;
  (pIVar14->DrawData).FramebufferScale.x = 0.0;
  pIVar15 = GImGui;
  (pIVar14->DrawData).FramebufferScale.y = 0.0;
  if ((pIVar14->DragDropActive == true) &&
     (IVar27 = (pIVar14->DragDropPayload).SourceId, IVar27 == pIVar14->ActiveId)) {
    if (GImGui->ActiveId == IVar27) {
      GImGui->ActiveIdIsAlive = IVar27;
    }
    if (pIVar15->ActiveIdPreviousFrame == IVar27) {
      pIVar15->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar14->HoveredIdPreviousFrame == 0) {
    IVar27 = pIVar14->HoveredId;
    pIVar14->HoveredIdTimer = 0.0;
    pIVar14->HoveredIdNotActiveTimer = 0.0;
    if (IVar27 == 0) goto LAB_0011f58d;
LAB_0011f562:
    fVar60 = (pIVar14->IO).DeltaTime;
    pIVar14->HoveredIdTimer = pIVar14->HoveredIdTimer + fVar60;
    IVar21 = IVar27;
    if (pIVar14->ActiveId != IVar27) {
      pIVar14->HoveredIdNotActiveTimer = fVar60 + pIVar14->HoveredIdNotActiveTimer;
      IVar21 = pIVar14->ActiveId;
    }
  }
  else {
    IVar27 = pIVar14->HoveredId;
    if (IVar27 != 0) {
      if (pIVar14->ActiveId == IVar27) {
        pIVar14->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_0011f562;
    }
LAB_0011f58d:
    IVar27 = 0;
    IVar21 = pIVar14->ActiveId;
  }
  pIVar14->HoveredIdPreviousFrame = IVar27;
  pIVar14->HoveredId = 0;
  pIVar14->HoveredIdAllowOverlap = false;
  if (((pIVar14->ActiveIdIsAlive != IVar21) && (IVar21 != 0)) &&
     (pIVar14->ActiveIdPreviousFrame == IVar21)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    IVar21 = pIVar14->ActiveId;
  }
  fVar60 = (pIVar14->IO).DeltaTime;
  if (IVar21 != 0) {
    pIVar14->ActiveIdTimer = pIVar14->ActiveIdTimer + fVar60;
  }
  pIVar14->LastActiveIdTimer = pIVar14->LastActiveIdTimer + fVar60;
  pIVar14->ActiveIdPreviousFrame = IVar21;
  pIVar14->ActiveIdPreviousFrameWindow = pIVar14->ActiveIdWindow;
  pIVar14->ActiveIdPreviousFrameHasBeenEdited = pIVar14->ActiveIdHasBeenEdited;
  pIVar14->ActiveIdIsAlive = 0;
  pIVar14->ActiveIdPreviousFrameIsAlive = false;
  pIVar14->ActiveIdIsJustActivated = false;
  if ((pIVar14->TempInputTextId != 0) && (IVar21 != pIVar14->TempInputTextId)) {
    pIVar14->TempInputTextId = 0;
  }
  pIVar14->DragDropAcceptIdPrev = pIVar14->DragDropAcceptIdCurr;
  pIVar14->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar14->DragDropAcceptIdCurr = 0;
  pIVar14->DragDropWithinSourceOrTarget = false;
  pfVar2 = (pIVar14->IO).KeysDownDuration;
  memcpy((pIVar14->IO).KeysDownDurationPrev,pfVar2,0x800);
  lVar25 = 0;
  do {
    fVar53 = -1.0;
    if ((pIVar14->IO).KeysDown[lVar25] == true) {
      fVar53 = 0.0;
      if (0.0 <= pfVar2[lVar25]) {
        fVar53 = pfVar2[lVar25] + fVar60;
      }
    }
    pfVar2[lVar25] = fVar53;
    pIVar15 = GImGui;
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x200);
  (GImGui->IO).WantSetMousePos = false;
  uVar42 = (pIVar15->IO).ConfigFlags;
  if (((uVar42 & 2) == 0) || (((pIVar15->IO).BackendFlags & 1) == 0)) {
    bVar13 = 0;
  }
  else if ((((0.0 < (pIVar15->IO).NavInputs[0]) || (0.0 < (pIVar15->IO).NavInputs[2])) ||
           (0.0 < (pIVar15->IO).NavInputs[1])) || (bVar13 = 1, 0.0 < (pIVar15->IO).NavInputs[3])) {
    pIVar15->NavInputSource = ImGuiInputSource_NavGamepad;
    bVar13 = 1;
  }
  if ((uVar42 & 1) != 0) {
    uVar43 = (pIVar15->IO).KeyMap[0xc];
    if (-1 < (long)(int)uVar43) {
      if (0x1ff < uVar43) goto LAB_001219fd;
      if ((pIVar15->IO).KeysDown[(int)uVar43] == true) {
        (pIVar15->IO).NavInputs[0] = 1.0;
        pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar43 = (pIVar15->IO).KeyMap[0xd];
    if (-1 < (long)(int)uVar43) {
      if (0x1ff < uVar43) goto LAB_001219fd;
      if ((pIVar15->IO).KeysDown[(int)uVar43] == true) {
        (pIVar15->IO).NavInputs[2] = 1.0;
        pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar43 = (pIVar15->IO).KeyMap[0xe];
    if (-1 < (long)(int)uVar43) {
      if (0x1ff < uVar43) goto LAB_001219fd;
      if ((pIVar15->IO).KeysDown[(int)uVar43] == true) {
        (pIVar15->IO).NavInputs[1] = 1.0;
        pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar43 = (pIVar15->IO).KeyMap[1];
    if (-1 < (long)(int)uVar43) {
      if (0x1ff < uVar43) goto LAB_001219fd;
      if ((pIVar15->IO).KeysDown[(int)uVar43] == true) {
        (pIVar15->IO).NavInputs[0x12] = 1.0;
        pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar43 = (pIVar15->IO).KeyMap[2];
    if (-1 < (long)(int)uVar43) {
      if (0x1ff < uVar43) goto LAB_001219fd;
      if ((pIVar15->IO).KeysDown[(int)uVar43] == true) {
        (pIVar15->IO).NavInputs[0x13] = 1.0;
        pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar43 = (pIVar15->IO).KeyMap[3];
    if (-1 < (long)(int)uVar43) {
      if (0x1ff < uVar43) goto LAB_001219fd;
      if ((pIVar15->IO).KeysDown[(int)uVar43] == true) {
        (pIVar15->IO).NavInputs[0x14] = 1.0;
        pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar43 = (pIVar15->IO).KeyMap[4];
    if (-1 < (long)(int)uVar43) {
      if (0x1ff < uVar43) goto LAB_001219fd;
      if ((pIVar15->IO).KeysDown[(int)uVar43] == true) {
        (pIVar15->IO).NavInputs[0x15] = 1.0;
        pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar43 = (pIVar15->IO).KeyMap[0];
    if (-1 < (long)(int)uVar43) {
      if (0x1ff < uVar43) {
LAB_001219fd:
        __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(GImGui->IO.KeysDown)/sizeof(*GImGui->IO.KeysDown)))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                      ,0x1022,"bool ImGui::IsKeyDown(int)");
      }
      if ((pIVar15->IO).KeysDown[(int)uVar43] == true) {
        (pIVar15->IO).NavInputs[0x11] = 1.0;
        pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    bVar40 = (pIVar15->IO).KeyCtrl;
    if (bVar40 == true) {
      (pIVar15->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar15->IO).KeyShift == true) {
      (pIVar15->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar40 == false) && ((pIVar15->IO).KeyAlt != false)) {
      (pIVar15->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar2 = (pIVar15->IO).NavInputsDownDuration;
  pfVar34 = pfVar2;
  pfVar38 = (pIVar15->IO).NavInputsDownDurationPrev;
  for (lVar25 = 0xb; lVar25 != 0; lVar25 = lVar25 + -1) {
    *(undefined8 *)pfVar38 = *(undefined8 *)pfVar34;
    pfVar34 = pfVar34 + (ulong)bVar41 * -4 + 2;
    pfVar38 = pfVar38 + (ulong)bVar41 * -4 + 2;
  }
  lVar25 = 0;
  do {
    fVar60 = -1.0;
    if (0.0 < (pIVar15->IO).NavInputs[lVar25]) {
      fVar60 = 0.0;
      if (0.0 <= pfVar2[lVar25]) {
        fVar60 = pfVar2[lVar25] + (pIVar15->IO).DeltaTime;
      }
    }
    pfVar2[lVar25] = fVar60;
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x16);
  IVar27 = pIVar15->NavInitResultId;
  if ((IVar27 != 0) &&
     ((pIVar15->NavDisableHighlight != true || (pIVar15->NavInitRequestFromMove == true)))) {
    if (pIVar15->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0x1e8f,"void ImGui::NavUpdate()");
    }
    IVar36 = pIVar15->NavLayer;
    if (pIVar15->NavInitRequestFromMove == true) {
      SetNavID(IVar27,IVar36);
      IVar45 = (pIVar15->NavInitResultRectRel).Max;
      pIVar5 = &pIVar15->NavWindow->NavRectRel[(int)IVar36].Min;
      *pIVar5 = (pIVar15->NavInitResultRectRel).Min;
      pIVar5[1] = IVar45;
      pIVar15->NavMousePosDirty = true;
      pIVar15->NavDisableHighlight = false;
      pIVar15->NavDisableMouseHover = true;
    }
    else {
      SetNavID(IVar27,IVar36);
    }
    IVar45 = (pIVar15->NavInitResultRectRel).Max;
    pIVar5 = &pIVar15->NavWindow->NavRectRel[pIVar15->NavLayer].Min;
    *pIVar5 = (pIVar15->NavInitResultRectRel).Min;
    pIVar5[1] = IVar45;
  }
  pIVar15->NavInitRequest = false;
  pIVar15->NavInitRequestFromMove = false;
  pIVar15->NavInitResultId = 0;
  pIVar15->NavJustMovedToId = 0;
  pIVar16 = GImGui;
  if (pIVar15->NavMoveRequest == true) {
    IVar27 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar27 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar16->NavDisableHighlight = false;
        pIVar16->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar3 = &GImGui->NavMoveResultOther;
      pIVar32 = &GImGui->NavMoveResultLocal;
      if (IVar27 == 0) {
        pIVar32 = pIVar3;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20) != 0) &&
          (IVar27 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar27 != 0)) &&
         (IVar27 != GImGui->NavId)) {
        pIVar32 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (pIVar32 == pIVar3) {
LAB_0011fb34:
        pIVar32 = pIVar3;
      }
      else if ((pIVar3->ID != 0) &&
              (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar60 = (GImGui->NavMoveResultOther).DistBox;
        fVar53 = pIVar32->DistBox;
        if (fVar53 <= fVar60) {
          if (((fVar60 != fVar53) || (NAN(fVar60) || NAN(fVar53))) ||
             (pfVar2 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar32->DistCenter < *pfVar2 || pIVar32->DistCenter == *pfVar2)) goto LAB_0011fb37;
        }
        goto LAB_0011fb34;
      }
LAB_0011fb37:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) || (pIVar32->Window == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                      ,0x1f93,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        IVar45 = pIVar32->Window->Pos;
        IVar7 = (pIVar32->RectRel).Min;
        IVar47 = (pIVar32->RectRel).Max;
        fVar60 = IVar45.x;
        fVar54 = IVar7.x + fVar60;
        fVar53 = IVar45.y;
        local_68.Max.x = IVar47.x + fVar60;
        local_68.Max.y = IVar47.y + fVar53;
        local_68.Min.y = IVar7.y + fVar53;
        local_68.Min.x = fVar54;
        uStack_50 = 0;
        local_58 = local_68.Max;
        NavScrollToBringItemIntoView(pIVar32->Window,&local_68);
        pIVar26 = pIVar32->Window;
        IVar45 = CalcNextScrollFromScrollTargetAndClamp(pIVar26,false);
        fVar55 = (pIVar26->Scroll).x - IVar45.x;
        fVar56 = (pIVar26->Scroll).y - IVar45.y;
        fVar60 = (pIVar32->RectRel).Min.y;
        fVar53 = (pIVar32->RectRel).Max.x;
        fVar44 = (pIVar32->RectRel).Max.y;
        (pIVar32->RectRel).Min.x = (pIVar32->RectRel).Min.x + fVar55;
        (pIVar32->RectRel).Min.y = fVar60 + fVar56;
        (pIVar32->RectRel).Max.x = fVar53 + fVar55;
        (pIVar32->RectRel).Max.y = fVar44 + fVar56;
        if ((pIVar26->Flags & 0x1000000) != 0) {
          local_40.Min.x = fVar55 + fVar54;
          local_40.Min.y = fVar56 + local_68.Min.y;
          local_40.Max.x = local_58.x + fVar55;
          local_40.Max.y = local_68.Max.y + fVar56;
          NavScrollToBringItemIntoView(pIVar26->ParentWindow,&local_40);
        }
      }
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar16->NavWindow = pIVar32->Window;
      IVar27 = pIVar32->ID;
      if (pIVar16->NavId != IVar27) {
        pIVar16->NavJustMovedToId = IVar27;
        pIVar16->NavJustMovedToMultiSelectScopeId = pIVar32->SelectScopeId;
      }
      pIVar17 = GImGui;
      IVar36 = pIVar16->NavLayer;
      SetNavID(IVar27,IVar36);
      IVar45 = (pIVar32->RectRel).Max;
      pIVar5 = &pIVar17->NavWindow->NavRectRel[(int)IVar36].Min;
      *pIVar5 = (pIVar32->RectRel).Min;
      pIVar5[1] = IVar45;
      pIVar17->NavMousePosDirty = true;
      pIVar17->NavDisableHighlight = false;
      pIVar17->NavDisableMouseHover = true;
      pIVar16->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar15->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar15->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0x1ea2,"void ImGui::NavUpdate()");
    }
    if (((pIVar15->NavMoveResultLocal).ID == 0) && ((pIVar15->NavMoveResultOther).ID == 0)) {
      pIVar15->NavDisableHighlight = false;
    }
    pIVar15->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar15->NavMousePosDirty == true) && (pIVar15->NavIdIsAlive == true)) {
    if (((((pIVar15->IO).ConfigFlags & 4) != 0) &&
        (((((pIVar15->IO).BackendFlags & 4) != 0 && (pIVar15->NavDisableHighlight == false)) &&
         (pIVar15->NavDisableMouseHover == true)))) && (pIVar15->NavWindow != (ImGuiWindow *)0x0)) {
      IVar45 = NavCalcPreferredRefPos();
      (pIVar15->IO).MousePosPrev = IVar45;
      (pIVar15->IO).MousePos = IVar45;
      (pIVar15->IO).WantSetMousePos = true;
    }
    pIVar15->NavMousePosDirty = false;
  }
  pIVar15->NavIdIsAlive = false;
  pIVar15->NavJustTabbedId = 0;
  IVar36 = pIVar15->NavLayer;
  if (ImGuiNavLayer_Menu < IVar36) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0x1eb8,"void ImGui::NavUpdate()");
  }
  pIVar26 = pIVar15->NavWindow;
  pIVar29 = pIVar26;
  if (pIVar26 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar29->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar29 != pIVar26) {
          pIVar29->NavLastChildNavWindow = pIVar26;
        }
        break;
      }
      ppIVar9 = &pIVar29->ParentWindow;
      pIVar29 = *ppIVar9;
    } while (*ppIVar9 != (ImGuiWindow *)0x0);
    if ((IVar36 == ImGuiNavLayer_Main) && (pIVar26->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar26->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar16 = GImGui;
  pIVar26 = GetFrontMostPopupModal();
  if (pIVar26 == (ImGuiWindow *)0x0) {
    if (pIVar16->NavWindowingTargetAnim == (ImGuiWindow *)0x0) {
      if (pIVar16->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_0011fe12;
LAB_0011fe2f:
      fVar60 = (pIVar16->IO).NavInputsDownDuration[3];
      if ((((pIVar16->IO).KeyCtrl == true) && (iVar24 = (pIVar16->IO).KeyMap[0], -1 < iVar24)) &&
         (bVar40 = IsKeyPressed(iVar24,true), bVar40)) {
        bVar41 = (byte)(pIVar16->IO).ConfigFlags;
        uVar43 = (uint)bVar41;
        if (fVar60 == 0.0 || (bVar41 & 1) != 0) {
LAB_0011fe89:
          pIVar26 = pIVar16->NavWindow;
          if ((pIVar26 != (ImGuiWindow *)0x0) ||
             (pIVar26 = FindWindowNavFocusable
                                  ((pIVar16->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
             pIVar26 != (ImGuiWindow *)0x0)) {
            pIVar16->NavWindowingTargetAnim = pIVar26;
            pIVar16->NavWindowingTarget = pIVar26;
            pIVar16->NavWindowingTimer = 0.0;
            pIVar16->NavWindowingHighlightAlpha = 0.0;
            pIVar16->NavWindowingToggleLayer = (bool)(~(byte)uVar43 & 1);
            pIVar16->NavInputSource = ImGuiInputSource_NavGamepad - (uVar43 & 1);
          }
        }
      }
      else if ((fVar60 == 0.0) && (!NAN(fVar60))) {
        uVar43 = 0;
        goto LAB_0011fe89;
      }
      fVar60 = (pIVar16->IO).DeltaTime + pIVar16->NavWindowingTimer;
      pIVar16->NavWindowingTimer = fVar60;
      if (pIVar16->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_0011ff11;
LAB_001200b1:
      bVar40 = false;
      pIVar26 = (ImGuiWindow *)0x0;
    }
    else {
      if (pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0) {
        fVar60 = (pIVar16->IO).DeltaTime * -10.0 + pIVar16->NavWindowingHighlightAlpha;
        fVar60 = (float)(-(uint)(0.0 <= fVar60) & (uint)fVar60);
        pIVar16->NavWindowingHighlightAlpha = fVar60;
        if ((pIVar16->DimBgRatio <= 0.0) && (fVar60 <= 0.0)) {
          pIVar16->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
        }
        goto LAB_0011fe2f;
      }
LAB_0011fe12:
      fVar60 = (pIVar16->IO).DeltaTime + pIVar16->NavWindowingTimer;
      pIVar16->NavWindowingTimer = fVar60;
LAB_0011ff11:
      IVar22 = pIVar16->NavInputSource;
      if (IVar22 != ImGuiInputSource_NavGamepad) {
LAB_0012001a:
        if (IVar22 == ImGuiInputSource_NavKeyboard) {
          fVar53 = (pIVar16->NavWindowingTimer + -0.2) / 0.05;
          fVar60 = 1.0;
          if (fVar53 <= 1.0) {
            fVar60 = fVar53;
          }
          fVar60 = (float)(~-(uint)(fVar53 < 0.0) & (uint)fVar60);
          uVar43 = -(uint)(fVar60 <= pIVar16->NavWindowingHighlightAlpha);
          pIVar16->NavWindowingHighlightAlpha =
               (float)(uVar43 & (uint)pIVar16->NavWindowingHighlightAlpha | ~uVar43 & (uint)fVar60);
          iVar24 = (GImGui->IO).KeyMap[0];
          if ((-1 < iVar24) && (bVar40 = IsKeyPressed(iVar24,true), bVar40)) {
            NavUpdateWindowingHighlightWindow((pIVar16->IO).KeyShift - 1 | 1);
          }
          if ((pIVar16->IO).KeyCtrl == false) {
            pIVar26 = pIVar16->NavWindowingTarget;
            bVar40 = false;
            goto LAB_001200fc;
          }
        }
        goto LAB_001200b1;
      }
      fVar53 = (fVar60 + -0.2) / 0.05;
      fVar60 = 1.0;
      if (fVar53 <= 1.0) {
        fVar60 = fVar53;
      }
      fVar60 = (float)(~-(uint)(fVar53 < 0.0) & (uint)fVar60);
      uVar43 = -(uint)(fVar60 <= pIVar16->NavWindowingHighlightAlpha);
      fVar60 = (float)(uVar43 & (uint)pIVar16->NavWindowingHighlightAlpha | ~uVar43 & (uint)fVar60);
      pIVar16->NavWindowingHighlightAlpha = fVar60;
      fVar53 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
      fVar44 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
      iVar24 = (uint)(0.0 < fVar53) - (uint)(0.0 < fVar44);
      if (iVar24 != 0) {
        NavUpdateWindowingHighlightWindow(iVar24);
        pIVar16->NavWindowingHighlightAlpha = 1.0;
        fVar60 = 1.0;
      }
      if (0.0 < (GImGui->IO).NavInputs[3]) {
        if (pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_001200b1;
        IVar22 = pIVar16->NavInputSource;
        goto LAB_0012001a;
      }
      pbVar39 = &pIVar16->NavWindowingToggleLayer;
      *pbVar39 = (bool)(*pbVar39 & fVar60 < 1.0);
      if (*pbVar39 == false) {
        pIVar26 = pIVar16->NavWindowingTarget;
        bVar40 = false;
      }
      else {
        bVar40 = pIVar16->NavWindow != (ImGuiWindow *)0x0;
        pIVar26 = (ImGuiWindow *)0x0;
      }
      pIVar16->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
LAB_001200fc:
    pIVar17 = GImGui;
    fVar60 = (GImGui->IO).NavInputsDownDuration[0x10];
    if ((fVar60 == 0.0) && (!NAN(fVar60))) {
      pIVar16->NavWindowingToggleLayer = true;
    }
    if ((((pIVar16->ActiveId == 0) || (pIVar16->ActiveIdAllowOverlap == true)) && (fVar60 < 0.0)) &&
       ((pIVar16->NavWindowingToggleLayer != false &&
        (0.0 <= (pIVar17->IO).NavInputsDownDurationPrev[0x10])))) {
      bVar20 = IsMousePosValid(&(pIVar16->IO).MousePos);
      bVar19 = IsMousePosValid(&(pIVar16->IO).MousePosPrev);
      bVar40 = (bool)(bVar19 == bVar20 | bVar40);
    }
    pIVar29 = pIVar16->NavWindowingTarget;
    if ((pIVar29 != (ImGuiWindow *)0x0) && (uVar43 = pIVar29->Flags, (uVar43 & 4) == 0)) {
      IVar22 = pIVar16->NavInputSource;
      if ((IVar22 == ImGuiInputSource_NavGamepad) ||
         ((IVar45.x = 0.0, IVar45.y = 0.0, IVar22 == ImGuiInputSource_NavKeyboard &&
          (IVar22 = ImGuiInputSource_Mouse, (pIVar16->IO).KeyShift == false)))) {
        IVar45 = GetNavInputAmount2d(IVar22,ImGuiInputReadMode_Down,0.0,0.0);
      }
      fVar60 = IVar45.x;
      fVar53 = IVar45.y;
      if ((((fVar60 != 0.0) || (NAN(fVar60))) || (fVar53 != 0.0)) || (NAN(fVar53))) {
        fVar44 = (pIVar16->IO).DisplayFramebufferScale.x;
        fVar54 = (pIVar16->IO).DisplayFramebufferScale.y;
        if (fVar54 <= fVar44) {
          fVar44 = fVar54;
        }
        fVar44 = (float)(int)(fVar44 * (pIVar16->IO).DeltaTime * 800.0);
        IVar45 = pIVar29->RootWindow->Pos;
        IVar7.y = IVar45.y + fVar53 * fVar44;
        IVar7.x = IVar45.x + fVar60 * fVar44;
        pIVar29->RootWindow->Pos = IVar7;
        pIVar16->NavDisableMouseHover = true;
        if (((uVar43 >> 8 & 1) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
          GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
        }
      }
    }
    if (pIVar26 != (ImGuiWindow *)0x0) {
      if ((pIVar16->NavWindow == (ImGuiWindow *)0x0) || (pIVar26 != pIVar16->NavWindow->RootWindow))
      {
        SetActiveID(0,(ImGuiWindow *)0x0);
        pIVar16->NavDisableHighlight = false;
        pIVar16->NavDisableMouseHover = true;
        pIVar29 = pIVar26->NavLastChildNavWindow;
        if (pIVar26->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
          pIVar29 = pIVar26;
        }
        ClosePopupsOverWindow(pIVar29,false);
        FocusWindow(pIVar29);
        if (pIVar29->NavLastIds[0] == 0) {
          NavInitWindow(pIVar29,false);
        }
        if ((pIVar29->DC).NavLayerActiveMask == 2) {
          pIVar16->NavLayer = ImGuiNavLayer_Menu;
        }
      }
      pIVar16->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((bVar40) && (pIVar26 = pIVar16->NavWindow, pIVar29 = pIVar26, pIVar26 != (ImGuiWindow *)0x0)
       ) {
      while (window = pIVar29, window->ParentWindow != (ImGuiWindow *)0x0) {
        if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
           (pIVar29 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
      }
      if (window != pIVar26) {
        FocusWindow(window);
        window->NavLastChildNavWindow = pIVar26;
        pIVar26 = pIVar16->NavWindow;
      }
      pIVar16->NavDisableHighlight = false;
      pIVar16->NavDisableMouseHover = true;
      IVar36 = ImGuiNavLayer_Main;
      if (((pIVar26->DC).NavLayerActiveMask & 2) != 0) {
        IVar36 = pIVar16->NavLayer ^ ImGuiNavLayer_Menu;
      }
      NavRestoreLayer(IVar36);
    }
  }
  else {
    pIVar16->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if (((bool)((uVar42 & 1) == 0 & (bVar13 ^ 1))) || (pIVar15->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar15->IO).NavActive = false;
LAB_001203b1:
    bVar40 = pIVar15->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar40 = (pIVar15->NavWindow->Flags & 0x40000U) == 0;
    (pIVar15->IO).NavActive = bVar40;
    if (((!bVar40) || (pIVar15->NavId == 0)) ||
       (bVar40 = true, pIVar15->NavDisableHighlight != false)) goto LAB_001203b1;
  }
  (pIVar15->IO).NavVisible = bVar40;
  fVar60 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar60 == 0.0) && (!NAN(fVar60))) {
    if (pIVar15->ActiveId == 0) {
      pIVar26 = pIVar15->NavWindow;
      if (((pIVar26 == (ImGuiWindow *)0x0) || ((pIVar26->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar26->ParentWindow == (ImGuiWindow *)0x0)) {
        iVar24 = (pIVar15->OpenPopupStack).Size;
        if ((long)iVar24 < 1) {
          if (pIVar15->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar26 != (ImGuiWindow *)0x0) && ((pIVar26->Flags & 0x5000000U) != 0x1000000)) {
              pIVar26->NavLastIds[0] = 0;
            }
            pIVar15->NavId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar15->OpenPopupStack).Data[(long)iVar24 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar24 + -1,true);
        }
      }
      else {
        if (pIVar26->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                        ,0x1ed4,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar26->ParentWindow);
        ppIVar9 = &GImGui->NavWindow;
        if (*ppIVar9 == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow",
                        "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                        ,0xa5e,"void ImGui::SetNavID(ImGuiID, int)");
        }
        IVar27 = pIVar26->ChildId;
        GImGui->NavId = IVar27;
        (*ppIVar9)->NavLastIds[0] = IVar27;
        pIVar15->NavIdIsAlive = false;
        if (pIVar15->NavDisableMouseHover == true) {
          pIVar15->NavMousePosDirty = true;
        }
      }
    }
    else if ((pIVar15->ActiveIdBlockNavInputFlags & 2) == 0) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
  }
  pIVar15->NavActivateId = 0;
  pIVar15->NavActivateDownId = 0;
  pIVar15->NavActivatePressedId = 0;
  pIVar16 = GImGui;
  pIVar15->NavInputId = 0;
  IVar27 = pIVar15->NavId;
  IVar21 = 0;
  if ((IVar27 == 0) || (pIVar15->NavDisableHighlight != false)) {
    IVar33 = 0;
LAB_0012052b:
    pIVar26 = pIVar15->NavWindow;
    bVar40 = pIVar26 == (ImGuiWindow *)0x0;
    if ((!bVar40) && ((pIVar26->Flags & 0x40000) != 0)) {
      pIVar15->NavDisableHighlight = true;
    }
    if (IVar21 != IVar33 && IVar33 != 0) {
      __assert_fail("g.NavActivateDownId == g.NavActivateId",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0x1f01,"void ImGui::NavUpdate()");
    }
  }
  else {
    IVar33 = 0;
    if (pIVar15->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_0012052b;
    IVar21 = 0;
    if (pIVar15->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar15->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          fVar60 = (GImGui->IO).NavInputsDownDuration[0];
          IVar18 = IVar27;
          if (0.0 <= fVar60) {
            IVar37 = pIVar15->ActiveId;
            if (IVar37 == 0 && fVar60 == 0.0) {
              pIVar15->NavActivateId = IVar27;
              pIVar15->NavActivateDownId = IVar27;
              IVar33 = IVar27;
            }
            else {
              if (IVar37 == 0) {
                pIVar15->NavActivateDownId = IVar27;
              }
              else {
                if (IVar37 != IVar27) goto LAB_001209c8;
                pIVar15->NavActivateDownId = IVar27;
              }
              IVar33 = 0;
              if ((fVar60 != 0.0) || (IVar33 = 0, NAN(fVar60))) goto LAB_00121423;
            }
            pIVar15->NavActivatePressedId = IVar27;
          }
          else {
            IVar37 = pIVar15->ActiveId;
            if ((IVar37 != 0) && (IVar37 != IVar27)) goto LAB_001209c8;
            pIVar15->NavActivateDownId = IVar27;
            IVar33 = 0;
          }
        }
        else {
          IVar37 = pIVar15->ActiveId;
          if (IVar37 == 0) {
            IVar33 = 0;
            IVar18 = 0;
          }
          else {
LAB_001209c8:
            IVar21 = 0;
            IVar33 = 0;
            IVar18 = 0;
            if (IVar37 != IVar27) goto LAB_0012052b;
          }
        }
LAB_00121423:
        IVar21 = IVar18;
        fVar60 = (pIVar16->IO).NavInputsDownDuration[2];
        if ((fVar60 == 0.0) && (!NAN(fVar60))) {
          pIVar15->NavInputId = IVar27;
        }
      }
      goto LAB_0012052b;
    }
    bVar40 = true;
    pIVar26 = (ImGuiWindow *)0x0;
  }
  pIVar15->NavMoveRequest = false;
  IVar27 = pIVar15->NavNextActivateId;
  if (IVar27 != 0) {
    pIVar15->NavActivateId = IVar27;
    pIVar15->NavActivateDownId = IVar27;
    pIVar15->NavActivatePressedId = IVar27;
    pIVar15->NavInputId = IVar27;
  }
  pIVar15->NavNextActivateId = 0;
  if (pIVar15->ActiveId == 0) {
    uVar43 = 0xffffffff;
  }
  else {
    uVar43 = pIVar15->ActiveIdAllowNavDirFlags;
  }
  if (pIVar15->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar15->NavMoveDir = -1;
    pIVar15->NavMoveRequestFlags = 0;
    IVar31 = -1;
    if (((!bVar40) && (uVar43 != 0 && pIVar15->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar26->Flags & 0x40000) == 0)) {
      IVar31 = -1;
      if ((uVar43 & 1) != 0) {
        fVar60 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat);
        fVar53 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar53 + fVar60) {
          pIVar15->NavMoveDir = 0;
          IVar31 = 0;
        }
      }
      if ((uVar43 & 2) != 0) {
        fVar60 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat);
        fVar53 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar53 + fVar60) {
          pIVar15->NavMoveDir = 1;
          IVar31 = 1;
        }
      }
      if ((uVar43 & 4) != 0) {
        fVar60 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat);
        fVar53 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar53 + fVar60) {
          pIVar15->NavMoveDir = 2;
          IVar31 = 2;
        }
      }
      if ((uVar43 & 8) != 0) {
        fVar60 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat);
        fVar53 = GetNavInputAmount(0x15,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar53 + fVar60) {
          pIVar15->NavMoveDir = 3;
          IVar31 = 3;
        }
      }
    }
    pIVar15->NavMoveClipDir = IVar31;
  }
  else {
    if ((pIVar15->NavMoveDir == -1) || (pIVar15->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0x1f1c,"void ImGui::NavUpdate()");
    }
    if (pIVar15->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0x1f1d,"void ImGui::NavUpdate()");
    }
    pIVar15->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar16 = GImGui;
  fVar60 = 0.0;
  if ((((uVar42 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
     ((pIVar26 = GImGui->NavWindow, pIVar26 != (ImGuiWindow *)0x0 &&
      ((((pIVar26->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       (GImGui->NavLayer == ImGuiNavLayer_Main)))))) {
    bVar40 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar20 = IsKeyDown((pIVar16->IO).KeyMap[6]);
    if (((byte)uVar43 >> 2 & bVar40) != ((byte)uVar43 >> 3 & bVar20)) {
      if (((pIVar26->DC).NavLayerActiveMask != 0) || ((pIVar26->DC).NavHasScroll != true)) {
        fVar53 = (pIVar26->NavRectRel[pIVar16->NavLayer].Max.y -
                 pIVar26->NavRectRel[pIVar16->NavLayer].Min.y) +
                 (((pIVar26->InnerMainRect).Max.y - (pIVar26->InnerMainRect).Min.y) -
                 GImGui->FontBaseSize * pIVar26->FontWindowScale);
        fVar53 = (float)(~-(uint)(fVar53 <= 0.0) & (uint)fVar53);
        bVar40 = IsKeyPressed((pIVar16->IO).KeyMap[5],true);
        if (bVar40) {
          pIVar16->NavMoveDir = 3;
          pIVar16->NavMoveClipDir = 2;
          pIVar16->NavMoveRequestFlags = 0x30;
          fVar60 = -fVar53;
        }
        else {
          bVar40 = IsKeyPressed((pIVar16->IO).KeyMap[6],true);
          fVar60 = 0.0;
          if (bVar40) {
            pIVar16->NavMoveDir = 2;
            pIVar16->NavMoveClipDir = 3;
            pIVar16->NavMoveRequestFlags = 0x30;
            fVar60 = fVar53;
          }
        }
        goto LAB_00120760;
      }
      bVar40 = IsKeyPressed((pIVar16->IO).KeyMap[5],true);
      if (bVar40) {
        fVar60 = (pIVar26->Scroll).y;
        fVar53 = (pIVar26->DC).CursorMaxPos.y;
        fVar44 = fVar60 - ((pIVar26->InnerMainRect).Max.y - (pIVar26->InnerMainRect).Min.y);
        (pIVar26->Scroll).y = fVar44;
        fVar44 = (fVar60 + fVar53) - fVar44;
      }
      else {
        bVar40 = IsKeyPressed((pIVar16->IO).KeyMap[6],true);
        if (!bVar40) goto LAB_001219b7;
        fVar60 = (pIVar26->Scroll).y;
        fVar44 = ((pIVar26->InnerMainRect).Max.y - (pIVar26->InnerMainRect).Min.y) + fVar60;
        fVar53 = (pIVar26->DC).CursorMaxPos.y;
        (pIVar26->Scroll).y = fVar44;
        fVar44 = (fVar60 + fVar53) - fVar44;
      }
      (pIVar26->DC).CursorMaxPos.y = fVar44;
    }
LAB_001219b7:
    fVar60 = 0.0;
  }
LAB_00120760:
  uVar42 = pIVar15->NavMoveDir;
  if (uVar42 == 0xffffffff) {
    bVar41 = pIVar15->NavMoveRequest;
    if ((bVar41 & 1) != 0) goto LAB_0012078f;
    bVar40 = false;
  }
  else {
    pIVar15->NavMoveRequest = true;
    pIVar15->NavMoveDirLast = uVar42;
    bVar41 = 1;
LAB_0012078f:
    bVar40 = true;
    if (pIVar15->NavId == 0) {
      pIVar15->NavInitRequest = true;
      pIVar15->NavInitRequestFromMove = true;
      pIVar15->NavInitResultId = 0;
      pIVar15->NavDisableHighlight = false;
    }
  }
  pIVar16 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar39 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar39;
    if (*pbVar39 != false) goto LAB_001208ba;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_001208ba:
    if (pIVar16->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0x1def,"void ImGui::NavUpdateAnyRequestFlag()");
    }
  }
  pIVar26 = pIVar15->NavWindow;
  if (((pIVar26 != (ImGuiWindow *)0x0) && ((pIVar26->Flags & 0x40000) == 0)) &&
     (pIVar15->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar53 = (float)(int)(pIVar16->FontBaseSize * pIVar26->FontWindowScale * 100.0 *
                          (pIVar15->IO).DeltaTime + 0.5);
    if (((pIVar26->DC).NavLayerActiveMask == 0) && ((bVar41 & (pIVar26->DC).NavHasScroll) == 1)) {
      if (uVar42 < 2) {
        fVar44 = (pIVar26->Scroll).x;
        fVar54 = (pIVar26->DC).CursorMaxPos.x;
        fVar55 = (float)(int)(*(float *)(&DAT_00196da8 + (ulong)(uVar42 == 0) * 4) * fVar53 + fVar44
                             );
        (pIVar26->Scroll).x = fVar55;
        (pIVar26->DC).CursorMaxPos.x = (fVar44 + fVar54) - fVar55;
      }
      else if ((uVar42 & 0xfffffffe) == 2) {
        fVar44 = (pIVar26->Scroll).y;
        fVar54 = (pIVar26->DC).CursorMaxPos.y;
        fVar55 = (float)(int)(*(float *)(&DAT_00196da8 + (ulong)(uVar42 == 2) * 4) * fVar53 + fVar44
                             );
        (pIVar26->Scroll).y = fVar55;
        (pIVar26->DC).CursorMaxPos.y = (fVar44 + fVar54) - fVar55;
      }
    }
    IVar45 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar44 = IVar45.x;
    fVar54 = IVar45.y;
    if (((fVar44 != 0.0) || (NAN(fVar44))) && (pIVar26->ScrollbarX == true)) {
      fVar55 = (pIVar26->Scroll).x;
      fVar56 = (float)(int)(fVar44 * fVar53 + fVar55);
      fVar44 = (pIVar26->DC).CursorMaxPos.x;
      (pIVar26->Scroll).x = fVar56;
      (pIVar26->DC).CursorMaxPos.x = (fVar55 + fVar44) - fVar56;
      pIVar15->NavMoveFromClampedRefRect = true;
    }
    if ((fVar54 != 0.0) || (NAN(fVar54))) {
      fVar44 = (pIVar26->Scroll).y;
      fVar54 = (float)(int)(fVar54 * fVar53 + fVar44);
      fVar53 = (pIVar26->DC).CursorMaxPos.y;
      (pIVar26->Scroll).y = fVar54;
      (pIVar26->DC).CursorMaxPos.y = (fVar44 + fVar53) - fVar54;
      pIVar15->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar15->NavMoveResultLocal).ID = 0;
  (pIVar15->NavMoveResultLocal).SelectScopeId = 0;
  (pIVar15->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar15->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar15->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar15->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar15->NavMoveResultLocal).RectRel.Min.x = 3.4028235e+38;
  *(undefined8 *)&(pIVar15->NavMoveResultLocal).RectRel.Min.y = 0xff7fffff7f7fffff;
  (pIVar15->NavMoveResultLocal).RectRel.Max.y = -3.4028235e+38;
  (pIVar15->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar15->NavMoveResultLocalVisibleSet).SelectScopeId = 0;
  (pIVar15->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar15->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar15->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar15->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar15->NavMoveResultLocalVisibleSet).RectRel.Min.x = 3.4028235e+38;
  *(undefined8 *)&(pIVar15->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0xff7fffff7f7fffff;
  (pIVar15->NavMoveResultLocalVisibleSet).RectRel.Max.y = -3.4028235e+38;
  (pIVar15->NavMoveResultOther).ID = 0;
  (pIVar15->NavMoveResultOther).SelectScopeId = 0;
  (pIVar15->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar15->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar15->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar15->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar15->NavMoveResultOther).RectRel.Min.x = 3.4028235e+38;
  *(undefined8 *)&(pIVar15->NavMoveResultOther).RectRel.Min.y = 0xff7fffff7f7fffff;
  (pIVar15->NavMoveResultOther).RectRel.Max.y = -3.4028235e+38;
  if (((bVar40) && (pIVar15->NavMoveFromClampedRefRect == true)) &&
     (pIVar15->NavLayer == ImGuiNavLayer_Main)) {
    IVar45 = (pIVar26->InnerMainRect).Min;
    fVar53 = (pIVar26->Pos).x;
    fVar54 = (pIVar26->Pos).y;
    fVar55 = (IVar45.x - fVar53) + -1.0;
    fVar56 = (IVar45.y - fVar54) + -1.0;
    IVar45 = (pIVar26->InnerMainRect).Max;
    fVar44 = (IVar45.x - fVar53) + 1.0;
    fVar54 = (IVar45.y - fVar54) + 1.0;
    IVar45 = pIVar26->NavRectRel[0].Min;
    fVar61 = IVar45.x;
    fVar53 = pIVar26->NavRectRel[0].Max.x;
    fVar62 = IVar45.y;
    if ((((fVar61 < fVar55) || (fVar62 < fVar56)) || (fVar44 < fVar53)) ||
       (fVar54 < pIVar26->NavRectRel[0].Max.y)) {
      auVar63._0_4_ = pIVar16->FontBaseSize * pIVar26->FontWindowScale * 0.5;
      auVar65._0_4_ = fVar44 - fVar55;
      auVar65._4_4_ = fVar54 - fVar56;
      auVar65._8_8_ = 0;
      auVar63._4_4_ = auVar63._0_4_;
      auVar63._8_4_ = auVar63._0_4_;
      auVar63._12_4_ = auVar63._0_4_;
      auVar66 = minps(auVar65,auVar63);
      fVar55 = fVar55 + auVar66._0_4_;
      fVar56 = fVar56 + auVar66._4_4_;
      uVar42 = -(uint)(fVar55 <= fVar61);
      uVar43 = -(uint)(fVar56 <= fVar62);
      pIVar26->NavRectRel[0].Min.x = (float)(~uVar42 & (uint)fVar55 | (uint)fVar61 & uVar42);
      pIVar26->NavRectRel[0].Min.y = (float)(~uVar43 & (uint)fVar56 | (uint)fVar62 & uVar43);
      auVar57._0_4_ = fVar44 - auVar66._0_4_;
      auVar57._4_4_ = fVar54 - auVar66._4_4_;
      auVar57._8_4_ = 0.0 - auVar66._8_4_;
      auVar57._12_4_ = 0.0 - auVar66._12_4_;
      auVar66._4_4_ = pIVar26->NavRectRel[0].Max.y;
      auVar66._0_4_ = fVar53;
      auVar66._8_8_ = 0;
      auVar57 = minps(auVar66,auVar57);
      pIVar26->NavRectRel[0].Max = auVar57._0_8_;
      pIVar15->NavId = 0;
      pIVar26 = pIVar15->NavWindow;
    }
    pIVar15->NavMoveFromClampedRefRect = false;
  }
  if (pIVar26 == (ImGuiWindow *)0x0) {
    IVar47 = (pIVar16->IO).DisplaySize;
    fVar53 = 0.0;
    fVar44 = 0.0;
  }
  else {
    IVar45 = pIVar26->NavRectRel[pIVar15->NavLayer].Min;
    IVar7 = pIVar26->NavRectRel[pIVar15->NavLayer].Max;
    fVar54 = IVar45.x;
    fVar55 = IVar45.y;
    IVar46.x = 0.0;
    IVar46.y = 0.0;
    fVar53 = 0.0;
    fVar44 = 0.0;
    if (fVar55 <= IVar7.y && fVar54 <= IVar7.x) {
      fVar53 = fVar54;
      fVar44 = fVar55;
      IVar46 = IVar7;
    }
    fVar54 = (pIVar26->Pos).x;
    fVar53 = fVar53 + fVar54;
    fVar55 = (pIVar26->Pos).y;
    fVar44 = fVar44 + fVar55;
    IVar47.x = IVar46.x + fVar54;
    IVar47.y = IVar46.y + fVar55;
  }
  (pIVar15->NavScoringRectScreen).Min.y = fVar44 + fVar60;
  fVar55 = IVar47.y + fVar60;
  (pIVar15->NavScoringRectScreen).Max.y = fVar55;
  fVar54 = fVar53 + 1.0;
  if (IVar47.x <= fVar53 + 1.0) {
    fVar54 = IVar47.x;
  }
  (pIVar15->NavScoringRectScreen).Min.x = fVar54;
  (pIVar15->NavScoringRectScreen).Max.x = fVar54;
  if (fVar55 < fVar44 + fVar60) {
    __assert_fail("!g.NavScoringRectScreen.IsInverted()",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0x1f6b,"void ImGui::NavUpdate()");
  }
  pIVar15->NavScoringCount = 0;
  pIVar5 = &(pIVar16->IO).MousePos;
  bVar40 = IsMousePosValid(pIVar5);
  if (bVar40) {
    IVar45 = (pIVar16->IO).MousePos;
    IVar48.x = (float)(int)IVar45.x;
    IVar48.y = (float)(int)IVar45.y;
    pIVar16->LastValidMousePos = IVar48;
    (pIVar16->IO).MousePos = IVar48;
  }
  bVar40 = IsMousePosValid(pIVar5);
  if ((bVar40) && (bVar40 = IsMousePosValid(&(pIVar16->IO).MousePosPrev), bVar40)) {
    IVar45 = (pIVar16->IO).MousePos;
    IVar7 = (pIVar16->IO).MousePosPrev;
    IVar49.x = IVar45.x - IVar7.x;
    IVar49.y = IVar45.y - IVar7.y;
    (pIVar16->IO).MouseDelta = IVar49;
    if (((IVar49.x != 0.0) || (NAN(IVar49.x))) || ((IVar49.y != 0.0 || (NAN(IVar49.y))))) {
      pIVar16->NavDisableMouseHover = false;
    }
  }
  else {
    (pIVar16->IO).MouseDelta.x = 0.0;
    (pIVar16->IO).MouseDelta.y = 0.0;
  }
  (pIVar16->IO).MousePosPrev = (pIVar16->IO).MousePos;
  lVar25 = 0;
  do {
    if ((pIVar16->IO).MouseDown[lVar25] == true) {
      fVar60 = (pIVar16->IO).MouseDownDuration[lVar25];
      pbVar39 = (pIVar16->IO).MouseClicked + lVar25;
      *pbVar39 = fVar60 < 0.0;
      pbVar39[10] = false;
      (pIVar16->IO).MouseDownDurationPrev[lVar25] = fVar60;
      if (0.0 <= fVar60) {
        (pIVar16->IO).MouseDownDuration[lVar25] = fVar60 + (pIVar16->IO).DeltaTime;
        (pIVar16->IO).MouseDoubleClicked[lVar25] = false;
        bVar40 = IsMousePosValid(pIVar5);
        auVar52 = ZEXT816(0);
        if (bVar40) {
          IVar45 = (pIVar16->IO).MousePos;
          IVar7 = (pIVar16->IO).MouseClickedPos[lVar25];
          auVar52._0_4_ = IVar45.x - IVar7.x;
          auVar52._4_4_ = IVar45.y - IVar7.y;
          auVar52._8_8_ = 0;
        }
        fVar60 = (pIVar16->IO).MouseDragMaxDistanceSqr[lVar25];
        fVar53 = auVar52._0_4_ * auVar52._0_4_ + auVar52._4_4_ * auVar52._4_4_;
        uVar42 = -(uint)(fVar53 <= fVar60);
        (pIVar16->IO).MouseDragMaxDistanceSqr[lVar25] =
             (float)(~uVar42 & (uint)fVar53 | (uint)fVar60 & uVar42);
        IVar45 = (pIVar16->IO).MouseDragMaxDistanceAbs[lVar25];
        fVar60 = IVar45.x;
        fVar53 = IVar45.y;
        auVar58._0_8_ = auVar52._0_8_ ^ 0x8000000080000000;
        auVar58._8_4_ = auVar52._8_4_ ^ 0x80000000;
        auVar58._12_4_ = auVar52._12_4_ ^ 0x80000000;
        auVar57 = maxps(auVar58,auVar52);
        uVar42 = -(uint)(auVar57._0_4_ <= fVar60);
        uVar43 = -(uint)(auVar57._4_4_ <= fVar53);
        (pIVar16->IO).MouseDragMaxDistanceAbs[lVar25] =
             (ImVec2)(CONCAT44(~uVar43 & (uint)auVar57._4_4_,~uVar42 & (uint)auVar57._0_4_) |
                     CONCAT44((uint)fVar53 & uVar43,(uint)fVar60 & uVar42));
      }
      else {
        (pIVar16->IO).MouseDownDuration[lVar25] = 0.0;
        (pIVar16->IO).MouseDoubleClicked[lVar25] = false;
        dVar50 = pIVar16->Time;
        if ((float)(dVar50 - (pIVar16->IO).MouseClickedTime[lVar25]) <
            (pIVar16->IO).MouseDoubleClickTime) {
          bVar40 = IsMousePosValid(pIVar5);
          fVar60 = 0.0;
          fVar53 = 0.0;
          if (bVar40) {
            IVar45 = (pIVar16->IO).MousePos;
            IVar7 = (pIVar16->IO).MouseClickedPos[lVar25];
            fVar60 = IVar45.x - IVar7.x;
            fVar53 = IVar45.y - IVar7.y;
          }
          fVar44 = (pIVar16->IO).MouseDoubleClickMaxDist;
          dVar50 = -3.4028234663852886e+38;
          if (fVar60 * fVar60 + fVar53 * fVar53 < fVar44 * fVar44) {
            (pIVar16->IO).MouseDoubleClicked[lVar25] = true;
            dVar50 = -3.4028234663852886e+38;
          }
        }
        (pIVar16->IO).MouseClickedTime[lVar25] = dVar50;
        (pIVar16->IO).MouseClickedPos[lVar25] = (pIVar16->IO).MousePos;
        (pIVar16->IO).MouseDownWasDoubleClick[lVar25] = (pIVar16->IO).MouseDoubleClicked[lVar25];
        pIVar6 = (pIVar16->IO).MouseDragMaxDistanceAbs + lVar25;
        pIVar6->x = 0.0;
        pIVar6->y = 0.0;
        (pIVar16->IO).MouseDragMaxDistanceSqr[lVar25] = 0.0;
      }
    }
    else {
      (pIVar16->IO).MouseClicked[lVar25] = false;
      fVar60 = (pIVar16->IO).MouseDownDuration[lVar25];
      (pIVar16->IO).MouseReleased[lVar25] = 0.0 <= fVar60;
      pbVar39 = (pIVar16->IO).MouseClicked + lVar25;
      (pIVar16->IO).MouseDownDurationPrev[lVar25] = fVar60;
      (pIVar16->IO).MouseDownDuration[lVar25] = -1.0;
      (pIVar16->IO).MouseDoubleClicked[lVar25] = false;
    }
    if (((pIVar16->IO).MouseDown[lVar25] == false) && ((pIVar16->IO).MouseReleased[lVar25] == false)
       ) {
      (pIVar16->IO).MouseDownWasDoubleClick[lVar25] = false;
    }
    if (*pbVar39 == true) {
      pIVar16->NavDisableMouseHover = false;
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 5);
  fVar60 = (pIVar14->IO).DeltaTime;
  iVar24 = pIVar14->FramerateSecPerFrameIdx;
  pIVar14->FramerateSecPerFrameAccum =
       (fVar60 - pIVar14->FramerateSecPerFrame[iVar24]) + pIVar14->FramerateSecPerFrameAccum;
  pIVar14->FramerateSecPerFrame[iVar24] = fVar60;
  iVar23 = iVar24 + (int)((ulong)((long)(iVar24 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar14->FramerateSecPerFrameIdx = iVar24 + 1 + ((iVar23 >> 6) - (iVar23 >> 0x1f)) * -0x78;
  uVar42 = -(uint)(0.0 < pIVar14->FramerateSecPerFrameAccum);
  (pIVar14->IO).Framerate =
       (float)(~uVar42 & 0x7f7fffff |
              (uint)(1.0 / (pIVar14->FramerateSecPerFrameAccum / 120.0)) & uVar42);
  UpdateMouseMovingWindowNewFrame();
  UpdateHoveredWindowAndCaptureFlags();
  pIVar26 = GetFrontMostPopupModal();
  if ((pIVar26 != (ImGuiWindow *)0x0) ||
     ((pIVar14->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar14->NavWindowingHighlightAlpha)))) {
    fVar60 = (pIVar14->IO).DeltaTime * 6.0 + pIVar14->DimBgRatio;
    if (1.0 <= fVar60) {
      fVar60 = 1.0;
    }
    pIVar14->DimBgRatio = fVar60;
  }
  else {
    fVar60 = (pIVar14->IO).DeltaTime * -10.0 + pIVar14->DimBgRatio;
    pIVar14->DimBgRatio = (float)(-(uint)(0.0 <= fVar60) & (uint)fVar60);
  }
  pIVar14->MouseCursor = 0;
  pIVar14->WantTextInputNextFrame = -1;
  pIVar14->WantCaptureMouseNextFrame = -1;
  pIVar14->WantCaptureKeyboardNextFrame = -1;
  (pIVar14->PlatformImePos).x = 1.0;
  pIVar15 = GImGui;
  (pIVar14->PlatformImePos).y = 1.0;
  pIVar26 = GImGui->HoveredWindow;
  if ((pIVar26 != (ImGuiWindow *)0x0) && (pIVar26->Collapsed == false)) {
    fVar60 = (GImGui->IO).MouseWheel;
    if ((fVar60 != 0.0) ||
       (((NAN(fVar60) || (fVar53 = (GImGui->IO).MouseWheelH, fVar53 != 0.0)) || (NAN(fVar53))))) {
      if ((((fVar60 == 0.0) && (!NAN(fVar60))) || ((GImGui->IO).KeyCtrl != true)) ||
         ((GImGui->IO).FontAllowUserScaling != true)) {
        do {
          if ((pIVar26->Flags & 0x1000218U) != 0x1000010) {
            if (((pIVar26->Flags & 0x210U) == 0) &&
               ((((fVar60 != 0.0 || (NAN(fVar60))) ||
                 ((fVar53 = (GImGui->IO).MouseWheelH, fVar53 != 0.0 || (NAN(fVar53))))) &&
                ((GImGui->IO).KeyCtrl == false)))) {
              fVar53 = (pIVar26->WindowPadding).x;
              fVar53 = (fVar53 + fVar53 +
                       ((pIVar26->ContentsRegionRect).Max.x - (pIVar26->ContentsRegionRect).Min.x))
                       * 0.67;
              if ((fVar60 != 0.0) || (NAN(fVar60))) {
                fVar44 = GImGui->FontBaseSize * pIVar26->FontWindowScale;
                if ((GImGui->IO).KeyShift == false) {
                  fVar54 = (pIVar26->WindowPadding).y;
                  fVar55 = (fVar54 + fVar54 +
                           ((pIVar26->ContentsRegionRect).Max.y -
                           (pIVar26->ContentsRegionRect).Min.y)) * 0.67;
                  fVar54 = fVar44 * 5.0;
                  if (fVar55 <= fVar44 * 5.0) {
                    fVar54 = fVar55;
                  }
                  fVar44 = (pIVar26->Scroll).y;
                  fVar54 = -fVar60 * (float)(int)fVar54 + fVar44;
                  fVar60 = (pIVar26->DC).CursorMaxPos.y;
                  (pIVar26->Scroll).y = fVar54;
                  (pIVar26->DC).CursorMaxPos.y = (fVar44 + fVar60) - fVar54;
                }
                else {
                  fVar54 = fVar44 + fVar44;
                  if (fVar53 <= fVar44 + fVar44) {
                    fVar54 = fVar53;
                  }
                  fVar44 = (pIVar26->Scroll).x;
                  fVar54 = -fVar60 * (float)(int)fVar54 + fVar44;
                  fVar60 = (pIVar26->DC).CursorMaxPos.x;
                  (pIVar26->Scroll).x = fVar54;
                  (pIVar26->DC).CursorMaxPos.x = (fVar44 + fVar60) - fVar54;
                }
              }
              fVar60 = (pIVar15->IO).MouseWheelH;
              if (((fVar60 != 0.0) || (NAN(fVar60))) && ((pIVar15->IO).KeyShift == false)) {
                fVar44 = pIVar15->FontBaseSize * pIVar26->FontWindowScale;
                fVar44 = fVar44 + fVar44;
                if (fVar53 <= fVar44) {
                  fVar44 = fVar53;
                }
                fVar53 = (pIVar26->Scroll).x;
                fVar54 = (pIVar26->DC).CursorMaxPos.x;
                fVar60 = fVar53 - fVar60 * (float)(int)fVar44;
                (pIVar26->Scroll).x = fVar60;
                (pIVar26->DC).CursorMaxPos.x = (fVar53 + fVar54) - fVar60;
              }
            }
            break;
          }
          pIVar26 = pIVar26->ParentWindow;
        } while (pIVar26 != (ImGuiWindow *)0x0);
      }
      else {
        fVar53 = pIVar26->FontWindowScale;
        fVar44 = fVar60 * 0.1 + fVar53;
        fVar60 = 2.5;
        if (fVar44 <= 2.5) {
          fVar60 = fVar44;
        }
        fVar60 = (float)(-(uint)(fVar44 < 0.5) & 0x3f000000 | ~-(uint)(fVar44 < 0.5) & (uint)fVar60)
        ;
        pIVar26->FontWindowScale = fVar60;
        if ((pIVar26->Flags & 0x1000000) == 0) {
          fVar60 = fVar60 / fVar53;
          fVar54 = 1.0 - fVar60;
          fVar53 = (pIVar26->Pos).x;
          fVar44 = (pIVar26->Pos).y;
          IVar45 = pIVar26->Size;
          auVar59._8_8_ = 0;
          auVar59._0_4_ = IVar45.x;
          auVar59._4_4_ = IVar45.y;
          IVar7 = (pIVar15->IO).MousePos;
          auVar64._0_4_ = (IVar7.x - fVar53) * fVar54 * IVar45.x;
          auVar64._4_4_ = (IVar7.y - fVar44) * fVar54 * IVar45.y;
          auVar64._8_4_ = fVar54 * 0.0 * 0.0;
          auVar64._12_4_ = fVar54 * 0.0 * 0.0;
          auVar57 = divps(auVar64,auVar59);
          IVar11.y = (float)(int)(auVar57._4_4_ + fVar44);
          IVar11.x = (float)(int)(auVar57._0_4_ + fVar53);
          pIVar26->Pos = IVar11;
          IVar12.y = (float)(int)(IVar45.y * fVar60);
          IVar12.x = (float)(int)(IVar45.x * fVar60);
          pIVar26->Size = IVar12;
          IVar51.x = (float)(int)(fVar60 * (pIVar26->SizeFull).x);
          IVar51.y = (float)(int)(fVar60 * (pIVar26->SizeFull).y);
          pIVar26->SizeFull = IVar51;
        }
      }
    }
  }
  pIVar26 = pIVar14->NavWindow;
  if (((pIVar26 == (ImGuiWindow *)0x0) || (pIVar26->Active != true)) ||
     (((pIVar26->Flags & 0x40000) != 0 ||
      (((pIVar14->IO).KeyCtrl != false || (iVar24 = (pIVar15->IO).KeyMap[0], iVar24 < 0)))))) {
    pIVar14->FocusTabPressed = false;
  }
  else {
    bVar40 = IsKeyPressed(iVar24,true);
    pIVar14->FocusTabPressed = bVar40;
    if ((bVar40) && (pIVar14->ActiveId == 0)) {
      pIVar26 = pIVar14->NavWindow;
      pIVar14->FocusRequestNextWindow = pIVar26;
      pIVar14->FocusRequestNextCounterAll = 0x7fffffff;
      if ((pIVar14->NavId == 0) || (pIVar14->NavIdTabCounter == 0x7fffffff)) {
        iVar24 = -(uint)(pIVar14->IO).KeyShift;
      }
      else {
        iVar24 = pIVar14->NavIdTabCounter + (-(uint)(pIVar14->IO).KeyShift | 1) + 1;
      }
      pIVar14->FocusRequestNextCounterTab = iVar24;
      goto LAB_0012159f;
    }
  }
  pIVar26 = pIVar14->FocusRequestNextWindow;
LAB_0012159f:
  pIVar14->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar14->FocusRequestCurrCounterAll = 0x7fffffff;
  pIVar14->FocusRequestCurrCounterTab = 0x7fffffff;
  if (pIVar26 != (ImGuiWindow *)0x0) {
    pIVar14->FocusRequestCurrWindow = pIVar26;
    if ((pIVar14->FocusRequestNextCounterAll != 0x7fffffff) &&
       (iVar24 = (pIVar26->DC).FocusCounterAll, iVar24 != -1)) {
      pIVar14->FocusRequestCurrCounterAll =
           (pIVar14->FocusRequestNextCounterAll + iVar24 + 1) % (iVar24 + 1);
    }
    if ((pIVar14->FocusRequestNextCounterTab != 0x7fffffff) &&
       (iVar24 = (pIVar26->DC).FocusCounterTab, iVar24 != -1)) {
      pIVar14->FocusRequestCurrCounterTab =
           (pIVar14->FocusRequestNextCounterTab + iVar24 + 1) % (iVar24 + 1);
    }
    pIVar14->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar14->FocusRequestNextCounterAll = 0x7fffffff;
    pIVar14->FocusRequestNextCounterTab = 0x7fffffff;
  }
  pIVar14->NavIdTabCounter = 0x7fffffff;
  uVar42 = (pIVar14->WindowsFocusOrder).Size;
  if (uVar42 != (pIVar14->Windows).Size) {
    __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xe15,"void ImGui::NewFrame()");
  }
  if ((ulong)uVar42 != 0) {
    uVar30 = 0;
    if (0 < (int)uVar42) {
      uVar30 = (ulong)uVar42;
    }
    uVar35 = 0;
    do {
      if (uVar30 == uVar35) {
        pcVar28 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_001219f3;
      }
      pIVar26 = (pIVar14->Windows).Data[uVar35];
      pIVar26->WasActive = pIVar26->Active;
      pIVar26->BeginCount = 0;
      pIVar26->Active = false;
      pIVar26->WriteAccessed = false;
      uVar35 = uVar35 + 1;
    } while (uVar42 != uVar35);
  }
  if ((pIVar14->NavWindow != (ImGuiWindow *)0x0) && (pIVar14->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  if ((pIVar14->CurrentWindowStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar4 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar4 = *piVar4 + 1;
    }
    __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar9 = (pIVar14->CurrentWindowStack).Data;
    if (ppIVar9 != (ImGuiWindow **)0x0) {
      memcpy(__dest,ppIVar9,(long)(pIVar14->CurrentWindowStack).Size << 3);
      ppIVar9 = (pIVar14->CurrentWindowStack).Data;
      if ((ppIVar9 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar4 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar4 = *piVar4 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar9,GImAllocatorUserData);
    }
    (pIVar14->CurrentWindowStack).Data = __dest;
    (pIVar14->CurrentWindowStack).Capacity = 0;
  }
  (pIVar14->CurrentWindowStack).Size = 0;
  if ((pIVar14->BeginPopupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar4 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar4 = *piVar4 + 1;
    }
    __dest_00 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar10 = (pIVar14->BeginPopupStack).Data;
    if (pIVar10 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_00,pIVar10,(long)(pIVar14->BeginPopupStack).Size * 0x30);
      pIVar10 = (pIVar14->BeginPopupStack).Data;
      if ((pIVar10 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar4 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar4 = *piVar4 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar10,GImAllocatorUserData);
    }
    (pIVar14->BeginPopupStack).Data = __dest_00;
    (pIVar14->BeginPopupStack).Capacity = 0;
  }
  (pIVar14->BeginPopupStack).Size = 0;
  ClosePopupsOverWindow(pIVar14->NavWindow,false);
  pIVar15 = GImGui;
  (pIVar15->NextWindowData).SizeVal.x = 400.0;
  (pIVar15->NextWindowData).SizeVal.y = 400.0;
  (pIVar15->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  pIVar14->FrameScopePushedImplicitWindow = true;
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check user data
    // (We pass an error message in the assert expression to make it visible to programmers who are not using a debugger, as most assert handlers display their argument)
    IM_ASSERT(g.Initialized);
    IM_ASSERT((g.IO.DeltaTime > 0.0f || g.FrameCount == 0)              && "Need a positive DeltaTime!");
    IM_ASSERT((g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount)  && "Forgot to call Render() or EndFrame() at the end of the previous frame?");
    IM_ASSERT(g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f  && "Invalid DisplaySize value!");
    IM_ASSERT(g.IO.Fonts->Fonts.Size > 0                                && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.IO.Fonts->Fonts[0]->IsLoaded()                          && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.Style.CurveTessellationTol > 0.0f                       && "Invalid style setting!");
    IM_ASSERT(g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f            && "Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!");
    IM_ASSERT(g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && "Invalid style setting.");
    for (int n = 0; n < ImGuiKey_COUNT; n++)
        IM_ASSERT(g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < IM_ARRAYSIZE(g.IO.KeysDown) && "io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)");

    // Perform simple check: required key mapping (we intentionally do NOT check all keys to not pressure user into setting up everything, but Space is required and was only recently added in 1.60 WIP)
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard)
        IM_ASSERT(g.IO.KeyMap[ImGuiKey_Space] != -1 && "ImGuiKey_Space is not mapped, required for keyboard navigation.");

    // Perform simple check: the beta io.ConfigWindowsResizeFromEdges option requires back-end to honor mouse cursor changes and set the ImGuiBackendFlags_HasMouseCursors flag accordingly.
    if (g.IO.ConfigWindowsResizeFromEdges && !(g.IO.BackendFlags & ImGuiBackendFlags_HasMouseCursors))
        g.IO.ConfigWindowsResizeFromEdges = false;

    // Load settings on first frame (if not explicitly loaded manually before)
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        if (g.IO.IniFilename)
            LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay after the last modification, so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
        {
            if (g.IO.IniFilename != NULL)
                SaveIniSettingsToDisk(g.IO.IniFilename);
            else
                g.IO.WantSaveIniSettings = true;  // Let user know they can call SaveIniSettingsToMemory(). user will need to clear io.WantSaveIniSettings themselves.
            g.SettingsDirtyTimer = 0.0f;
        }
    }

    g.Time += g.IO.DeltaTime;
    g.FrameScopeActive = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;

    g.BackgroundDrawList.Clear();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();
    g.BackgroundDrawList.Flags = (g.Style.AntiAliasedLines ? ImDrawListFlags_AntiAliasedLines : 0) | (g.Style.AntiAliasedFill ? ImDrawListFlags_AntiAliasedFill : 0);

    g.ForegroundDrawList.Clear();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();
    g.ForegroundDrawList.Flags = (g.Style.AntiAliasedLines ? ImDrawListFlags_AntiAliasedLines : 0) | (g.Style.AntiAliasedFill ? ImDrawListFlags_AntiAliasedFill : 0);

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEdited = g.ActiveIdHasBeenEdited;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputTextId != 0 && g.ActiveId != g.TempInputTextId)
        g.TempInputTextId = 0;

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSourceOrTarget = false;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();
    UpdateHoveredWindowAndCaptureFlags();

    // Background darkening/whitening
    if (GetFrontMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Pressing TAB activate widget focus
    g.FocusTabPressed = (g.NavWindow && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab));
    if (g.ActiveId == 0 && g.FocusTabPressed)
    {
        // Note that SetKeyboardFocusHere() sets the Next fields mid-frame. To be consistent we also
        // manipulate the Next fields even, even though they will be turned into Curr fields by the code below.
        g.FocusRequestNextWindow = g.NavWindow;
        g.FocusRequestNextCounterAll = INT_MAX;
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.FocusRequestNextCounterTab = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.FocusRequestNextCounterTab = g.IO.KeyShift ? -1 : 0;
    }

    // Turn queued focus request into current one
    g.FocusRequestCurrWindow = NULL;
    g.FocusRequestCurrCounterAll = g.FocusRequestCurrCounterTab = INT_MAX;
    if (g.FocusRequestNextWindow != NULL)
    {
        ImGuiWindow* window = g.FocusRequestNextWindow;
        g.FocusRequestCurrWindow = window;
        if (g.FocusRequestNextCounterAll != INT_MAX && window->DC.FocusCounterAll != -1)
            g.FocusRequestCurrCounterAll = ImModPositive(g.FocusRequestNextCounterAll, window->DC.FocusCounterAll + 1);
        if (g.FocusRequestNextCounterTab != INT_MAX && window->DC.FocusCounterTab != -1)
            g.FocusRequestCurrCounterTab = ImModPositive(g.FocusRequestNextCounterTab, window->DC.FocusCounterTab + 1);
        g.FocusRequestNextWindow = NULL;
        g.FocusRequestNextCounterAll = g.FocusRequestNextCounterTab = INT_MAX;
    }

    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    g.FrameScopePushedImplicitWindow = true;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}